

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.cpp
# Opt level: O0

fstream * ScanByChar_abi_cxx11_(fstream *file)

{
  byte bVar1;
  bool bVar2;
  istream *piVar3;
  istream *in_RSI;
  char local_1a [2];
  char c;
  istream *piStack_18;
  fstream *file_local;
  string *str;
  
  local_1a[1] = 0;
  piStack_18 = in_RSI;
  file_local = file;
  std::__cxx11::string::string((string *)file);
  std::istream::operator>>(piStack_18,std::noskipws);
  bVar1 = std::fstream::is_open();
  if ((bVar1 & 1) != 0) {
    while( true ) {
      piVar3 = std::operator>>(piStack_18,local_1a);
      bVar2 = std::ios::operator_cast_to_bool((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
      if ((!bVar2) || (bVar1 = std::ios::eof(), (bVar1 & 1) != 0)) break;
      std::__cxx11::string::operator+=((string *)file,local_1a[0]);
    }
    std::fstream::close();
    return file;
  }
  std::operator<<((ostream *)&std::cout,"Could not find the file\n");
  exit(1);
}

Assistant:

string ScanByChar(fstream &file) {
    string str;
    char c;
    file >> noskipws;//not ignore space
    if (!file.is_open()) {
        cout << "Could not find the file\n";
        exit(EXIT_FAILURE);
    }
    while (file >> c) {  //// if while( !file.eof() ) , will repeat read the char at last
        if (file.eof()) break;
        str += c;
    }
    file.close();
    return str;
}